

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_object_dotset_boolean(JSON_Object *object,char *name,int boolean)

{
  JSON_Status JVar1;
  JSON_Value *value;
  JSON_Status JVar2;
  
  value = (JSON_Value *)(*parson_malloc)(0x20);
  if (value == (JSON_Value *)0x0) {
    value = (JSON_Value *)0x0;
  }
  else {
    value->parent = (JSON_Value *)0x0;
    value->type = 6;
    *(uint *)&value->value = (uint)(boolean != 0);
  }
  JVar2 = -1;
  if (value != (JSON_Value *)0x0) {
    JVar1 = json_object_dotset_value(object,name,value);
    if (JVar1 == 0) {
      JVar2 = 0;
    }
    else {
      json_value_free(value);
    }
  }
  return JVar2;
}

Assistant:

JSON_Status json_object_dotset_boolean(JSON_Object *object, const char *name, int boolean) {
    JSON_Value *value = json_value_init_boolean(boolean);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_object_dotset_value(object, name, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}